

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

uoffset_t __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::EndTable
          (FlatBufferBuilderImpl<false> *this,uoffset_t start)

{
  uint8_t **ppuVar1;
  undefined4 uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  undefined8 in_RAX;
  uint8_t *puVar7;
  voffset_t *pvVar8;
  uint8_t *puVar9;
  ushort *__s2;
  uint *puVar10;
  uint *puVar11;
  ushort uVar12;
  uint uVar13;
  ushort *__s1;
  type vt_use;
  uint local_34;
  
  if (this->nested == false) {
    __assert_fail("nested",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                  ,0x1a4,
                  "uoffset_t flatbuffers::FlatBufferBuilderImpl<>::EndTable(uoffset_t) [Is64Aware = false]"
                 );
  }
  _vt_use = in_RAX;
  uVar4 = PushElement<int,unsigned_int>(this,0);
  uVar3 = (short)*(undefined4 *)&this->max_voffset_ + 2;
  uVar12 = 4;
  if (4 < uVar3) {
    uVar12 = uVar3;
  }
  this->max_voffset_ = uVar12;
  vector_downward<unsigned_int>::fill_big(&this->buf_,(ulong)uVar12);
  if (0xffff < uVar4 - start) {
    __assert_fail("table_object_size < 0x10000",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                  ,0x1b5,
                  "uoffset_t flatbuffers::FlatBufferBuilderImpl<>::EndTable(uoffset_t) [Is64Aware = false]"
                 );
  }
  puVar7 = vector_downward<unsigned_int>::data(&this->buf_);
  *(short *)(puVar7 + 2) = (short)(uVar4 - start);
  pvVar8 = (voffset_t *)vector_downward<unsigned_int>::data(&this->buf_);
  *pvVar8 = this->max_voffset_;
  puVar7 = vector_downward<unsigned_int>::scratch_end(&this->buf_);
  puVar7 = puVar7 + (ulong)this->num_field_loc * -8;
  while( true ) {
    puVar9 = vector_downward<unsigned_int>::scratch_end(&this->buf_);
    if (puVar9 <= puVar7) break;
    uVar2 = *(undefined4 *)puVar7;
    puVar9 = vector_downward<unsigned_int>::data(&this->buf_);
    if (*(short *)(puVar9 + *(ushort *)(puVar7 + 4)) != 0) {
      __assert_fail("!ReadScalar<voffset_t>(buf_.data() + field_location->id)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                    ,0x1c1,
                    "uoffset_t flatbuffers::FlatBufferBuilderImpl<>::EndTable(uoffset_t) [Is64Aware = false]"
                   );
    }
    puVar9 = vector_downward<unsigned_int>::data(&this->buf_);
    *(short *)(puVar9 + *(ushort *)(puVar7 + 4)) = (short)uVar4 - (short)uVar2;
    puVar7 = puVar7 + 8;
  }
  ppuVar1 = &(this->buf_).scratch_;
  *ppuVar1 = *ppuVar1 + (ulong)this->num_field_loc * -8;
  this->num_field_loc = 0;
  this->max_voffset_ = 0;
  __s2 = (ushort *)vector_downward<unsigned_int>::data(&this->buf_);
  uVar12 = *__s2;
  uVar13 = (this->buf_).size_;
  _vt_use = CONCAT44(local_34,uVar13);
  if (this->dedup_vtables_ != false) {
    _vt_use = CONCAT44(uVar13,uVar13);
    puVar10 = (uint *)vector_downward<unsigned_int>::scratch_data(&this->buf_);
    while( true ) {
      puVar11 = (uint *)vector_downward<unsigned_int>::scratch_end(&this->buf_);
      if (puVar11 <= puVar10) break;
      uVar13 = *puVar10;
      __s1 = (ushort *)((this->buf_).buf_ + ((this->buf_).reserved_ - (ulong)uVar13));
      if (uVar12 == *__s1) {
        iVar5 = bcmp(__s1,__s2,(ulong)uVar12);
        if (iVar5 == 0) {
          _vt_use = CONCAT44(local_34,uVar13);
          ppuVar1 = &(this->buf_).cur_;
          *ppuVar1 = *ppuVar1 + ((this->buf_).size_ - uVar4);
          (this->buf_).size_ = uVar4;
          uVar6 = uVar4;
          goto LAB_0011bc46;
        }
      }
      puVar10 = puVar10 + 1;
    }
    uVar6 = (this->buf_).size_;
    uVar13 = local_34;
LAB_0011bc46:
    if (uVar13 != uVar6) goto LAB_0011bc5b;
  }
  vector_downward<unsigned_int>::scratch_push_small<unsigned_int>(&this->buf_,&vt_use);
  uVar13 = vt_use;
LAB_0011bc5b:
  *(uint *)((this->buf_).buf_ +
           ((this->buf_).reserved_ - ((ulong)uVar4 + this->length_of_64_bit_region_))) =
       uVar13 - uVar4;
  this->nested = false;
  return uVar4;
}

Assistant:

uoffset_t EndTable(uoffset_t start) {
    // If you get this assert, a corresponding StartTable wasn't called.
    FLATBUFFERS_ASSERT(nested);
    // Write the vtable offset, which is the start of any Table.
    // We fill its value later.
    // This is relative to the end of the 32-bit region.
    const uoffset_t vtable_offset_loc =
        static_cast<uoffset_t>(PushElement<soffset_t>(0));
    // Write a vtable, which consists entirely of voffset_t elements.
    // It starts with the number of offsets, followed by a type id, followed
    // by the offsets themselves. In reverse:
    // Include space for the last offset and ensure empty tables have a
    // minimum size.
    max_voffset_ =
        (std::max)(static_cast<voffset_t>(max_voffset_ + sizeof(voffset_t)),
                   FieldIndexToOffset(0));
    buf_.fill_big(max_voffset_);
    const uoffset_t table_object_size = vtable_offset_loc - start;
    // Vtable use 16bit offsets.
    FLATBUFFERS_ASSERT(table_object_size < 0x10000);
    WriteScalar<voffset_t>(buf_.data() + sizeof(voffset_t),
                           static_cast<voffset_t>(table_object_size));
    WriteScalar<voffset_t>(buf_.data(), max_voffset_);
    // Write the offsets into the table
    for (auto it = buf_.scratch_end() - num_field_loc * sizeof(FieldLoc);
         it < buf_.scratch_end(); it += sizeof(FieldLoc)) {
      auto field_location = reinterpret_cast<FieldLoc *>(it);
      const voffset_t pos =
          static_cast<voffset_t>(vtable_offset_loc - field_location->off);
      // If this asserts, it means you've set a field twice.
      FLATBUFFERS_ASSERT(
          !ReadScalar<voffset_t>(buf_.data() + field_location->id));
      WriteScalar<voffset_t>(buf_.data() + field_location->id, pos);
    }
    ClearOffsets();
    auto vt1 = reinterpret_cast<voffset_t *>(buf_.data());
    auto vt1_size = ReadScalar<voffset_t>(vt1);
    auto vt_use = GetSizeRelative32BitRegion();
    // See if we already have generated a vtable with this exact same
    // layout before. If so, make it point to the old one, remove this one.
    if (dedup_vtables_) {
      for (auto it = buf_.scratch_data(); it < buf_.scratch_end();
           it += sizeof(uoffset_t)) {
        auto vt_offset_ptr = reinterpret_cast<uoffset_t *>(it);
        auto vt2 = reinterpret_cast<voffset_t *>(buf_.data_at(*vt_offset_ptr));
        auto vt2_size = ReadScalar<voffset_t>(vt2);
        if (vt1_size != vt2_size || 0 != memcmp(vt2, vt1, vt1_size)) continue;
        vt_use = *vt_offset_ptr;
        buf_.pop(GetSizeRelative32BitRegion() - vtable_offset_loc);
        break;
      }
    }
    // If this is a new vtable, remember it.
    if (vt_use == GetSizeRelative32BitRegion()) {
      buf_.scratch_push_small(vt_use);
    }
    // Fill the vtable offset we created above.
    // The offset points from the beginning of the object to where the vtable is
    // stored.
    // Offsets default direction is downward in memory for future format
    // flexibility (storing all vtables at the start of the file).
    WriteScalar(buf_.data_at(vtable_offset_loc + length_of_64_bit_region_),
                static_cast<soffset_t>(vt_use) -
                    static_cast<soffset_t>(vtable_offset_loc));
    nested = false;
    return vtable_offset_loc;
  }